

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseRAPass::_dumpLiveSpans(BaseRAPass *this,String *sb)

{
  uint uVar1;
  uint uVar2;
  RAWorkReg *pRVar3;
  long lVar4;
  RAWorkReg **ppRVar5;
  RALiveSpan<asmjit::v1_14::LiveRegData> *pRVar6;
  char *str;
  size_t i;
  uint32_t x;
  ulong uVar7;
  
  uVar1 = *(uint *)&this->field_0x148;
  uVar2 = this->_maxWorkRegNameSize;
  for (i = 0; i != uVar1; i = i + 1) {
    ppRVar5 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[](&this->_workRegs,i);
    pRVar3 = *ppRVar5;
    String::_opString(sb,kAppend,"  ",0xffffffffffffffff);
    uVar7 = (ulong)(byte)*sb;
    if (0x1e < uVar7) {
      uVar7 = *(ulong *)(sb + 8);
    }
    lVar4 = *(long *)(pRVar3 + 8);
    if (*(uint *)(lVar4 + 0x18) < 0xc) {
      str = (char *)(lVar4 + 0x1c);
    }
    else {
      str = *(char **)(lVar4 + 0x20);
    }
    String::_opString(sb,kAppend,str,0xffffffffffffffff);
    String::padEnd(sb,uVar7 + uVar2,' ');
    String::_opFormat(sb,kAppend," {id:%04u width: %-4u freq: %0.4f priority=%0.4f}",
                      (double)*(float *)(pRVar3 + 100),(double)*(float *)(pRVar3 + 0x68),
                      (ulong)*(uint *)(pRVar3 + 4),(ulong)*(uint *)(pRVar3 + 0x60));
    String::_opString(sb,kAppend,": ",0xffffffffffffffff);
    for (uVar7 = 0; uVar7 < *(uint *)(pRVar3 + 0x58); uVar7 = uVar7 + 1) {
      pRVar6 = ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>::operator[]
                         ((ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)
                          (pRVar3 + 0x50),uVar7);
      if (uVar7 != 0) {
        String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      }
      String::_opFormat(sb,kAppend,"[%u:%u]",(ulong)*(uint *)pRVar6,(ulong)*(uint *)(pRVar6 + 4));
    }
    String::_opChar(sb,kAppend,'\n');
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseRAPass::_dumpLiveSpans(String& sb) noexcept {
  uint32_t numWorkRegs = _workRegs.size();
  uint32_t maxSize = _maxWorkRegNameSize;

  for (uint32_t workId = 0; workId < numWorkRegs; workId++) {
    RAWorkReg* workReg = _workRegs[workId];

    sb.append("  ");

    size_t oldSize = sb.size();
    sb.append(workReg->name());
    sb.padEnd(oldSize + maxSize);

    RALiveStats& stats = workReg->liveStats();
    sb.appendFormat(" {id:%04u width: %-4u freq: %0.4f priority=%0.4f}",
      workReg->virtId(),
      stats.width(),
      stats.freq(),
      stats.priority());
    sb.append(": ");

    LiveRegSpans& liveSpans = workReg->liveSpans();
    for (uint32_t x = 0; x < liveSpans.size(); x++) {
      const LiveRegSpan& liveSpan = liveSpans[x];
      if (x)
        sb.append(", ");
      sb.appendFormat("[%u:%u]", liveSpan.a, liveSpan.b);
    }

    sb.append('\n');
  }

  return kErrorOk;
}